

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

bool __thiscall jbcoin::STObject::clearFlag(STObject *this,uint32_t f)

{
  STBase *pSVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  pSVar1 = getPField(this,(SField *)sfFlags,false);
  if (pSVar1 != (STBase *)0x0) {
    bVar3 = false;
    lVar2 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar2 != 0) {
      *(uint *)(lVar2 + 0x10) = *(uint *)(lVar2 + 0x10) & ~f;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool STObject::clearFlag (std::uint32_t f)
{
    STUInt32* t = dynamic_cast<STUInt32*> (getPField (sfFlags));

    if (!t)
        return false;

    t->setValue (t->value () & ~f);
    return true;
}